

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

bool pugi::impl::anon_unknown_0::strequal(char_t *src,char_t *dst)

{
  int iVar1;
  char *in_RSI;
  char *in_RDI;
  
  iVar1 = strcmp(in_RDI,in_RSI);
  return iVar1 == 0;
}

Assistant:

PUGI_IMPL_FN bool strequal(const char_t* src, const char_t* dst)
	{
		assert(src && dst);

	#ifdef PUGIXML_WCHAR_MODE
		return wcscmp(src, dst) == 0;
	#else
		return strcmp(src, dst) == 0;
	#endif
	}